

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFNode.cpp
# Opt level: O2

int __thiscall FFNode::init(FFNode *this,EVP_PKEY_CTX *ctx)

{
  pointer pfVar1;
  num_t *b;
  pointer pfVar2;
  num_t *w;
  result_type rVar3;
  normal_distribution<float> dist;
  normal_distribution<float> local_38;
  
  local_38._M_param._M_stddev =
       (float)SQRT(*(double *)(&DAT_00106210 + (ulong)(this->activation_ == ReLU) * 8) /
                   (double)this->input_size_);
  local_38._M_param._M_mean = 0.0;
  local_38._M_saved = 0.0;
  local_38._M_saved_available = false;
  pfVar1 = (this->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar2 = (this->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    rVar3 = std::normal_distribution<float>::operator()
                      (&local_38,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)ctx);
    *pfVar2 = rVar3;
  }
  pfVar1 = (this->biases_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar2 = (this->biases_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    *pfVar2 = 0.01;
  }
  return (int)pfVar2;
}

Assistant:

void FFNode::init(rne_t& rne)
{
    num_t sigma;
    switch (activation_)
    {
    case Activation::ReLU:
        // Kaiming He, et. al. weight initialization for ReLU networks
        // https://arxiv.org/pdf/1502.01852.pdf
        //
        // Suggests using a normal distribution with variance := 2 / n_in
        sigma = std::sqrt(2.0 / static_cast<num_t>(input_size_));
        break;
    case Activation::Softmax:
    default:
        sigma = std::sqrt(1.0 / static_cast<num_t>(input_size_));
        break;
    }

    // NOTE: Unfortunately, the C++ standard does not guarantee that the results
    // obtained from a distribution function will be identical given the same
    // inputs across different compilers and platforms. A production ML
    // framework will likely implement its own distributions to provide
    // deterministic results.
    auto dist = std::normal_distribution<num_t>{0.0, sigma};

    for (num_t& w : weights_)
    {
        w = dist(rne);
    }

    // NOTE: Setting biases to zero is a common practice, as is initializing the
    // bias to a small value (e.g. on the order of 0.01). It is unclear if the
    // latter produces a consistent result over the former, but the thinking is
    // that a non-zero bias will ensure that the neuron always "fires" at the
    // beginning to produce a signal.
    //
    // Here, we initialize all biases to a small number, but the reader should
    // consider experimenting with other approaches.
    for (num_t& b : biases_)
    {
        b = 0.01;
    }
}